

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::SetWhat<char_const*&,char_const(&)[7]>
          (Exception *this,ostringstream *oss,char **arg,char (*args) [7])

{
  char (*in_RCX) [7];
  ostringstream *in_RDX;
  ostream *in_RSI;
  
  std::operator<<(in_RSI,*(char **)in_RDX);
  SetWhat<char_const(&)[7]>((Exception *)in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }